

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_impl::start_natpmp
          (session_impl *this,shared_ptr<libtorrent::aux::listen_socket_t> *s)

{
  _Atomic_word *p_Var1;
  element_type *peVar2;
  io_context *__args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  _Atomic_word _Var6;
  address_v4 aVar7;
  undefined1 local_1c9;
  listen_socket_handle local_1c8;
  ip_interface local_1b8;
  
  peVar2 = (s->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if ((peVar2->local_endpoint).impl_.data_.base.sa_family != 2) {
    local_1b8.interface_address.ipv6_address_.addr_.__in6_u._0_8_ =
         *(undefined8 *)((long)&(peVar2->local_endpoint).impl_.data_ + 8);
    local_1b8.interface_address.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)((long)&(peVar2->local_endpoint).impl_.data_ + 0x10);
    local_1b8.interface_address.ipv6_address_.scope_id_ =
         (unsigned_long)(peVar2->local_endpoint).impl_.data_.v6.sin6_scope_id;
    local_1b8.interface_address._0_8_ = (element_type *)0x1;
    bVar5 = is_local(&local_1b8.interface_address);
    if (bVar5) {
      return;
    }
  }
  local_1c8.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (s->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if ((((local_1c8.m_sock.
         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       natpmp_mapper).super___shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) &&
     ((((local_1c8.m_sock.
         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       flags).m_val & 10) == 0)) {
    __args = this->m_io_context;
    this_00 = (s->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_weak_count = this_00->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_weak_count = this_00->_M_weak_count + 1;
      }
    }
    local_1c8.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    ::std::__shared_ptr<libtorrent::natpmp,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<libtorrent::natpmp>,boost::asio::io_context&,libtorrent::aux::session_impl&,libtorrent::aux::listen_socket_handle>
              ((__shared_ptr<libtorrent::natpmp,(__gnu_cxx::_Lock_policy)2> *)&local_1b8,
               (allocator<libtorrent::natpmp> *)&local_1c9,__args,this,&local_1c8);
    uVar4 = local_1b8.interface_address.ipv6_address_.addr_.__in6_u._0_8_;
    uVar3 = local_1b8.interface_address._0_8_;
    peVar2 = (s->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_1b8.interface_address.type_ = ipv4;
    local_1b8.interface_address.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    local_1b8.interface_address.ipv6_address_.addr_.__in6_u._0_8_ =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = (peVar2->natpmp_mapper).
              super___shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (peVar2->natpmp_mapper).super___shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar3;
    (peVar2->natpmp_mapper).super___shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_1b8.interface_address.ipv6_address_.addr_.__in6_u._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_1b8.interface_address.ipv6_address_.addr_.__in6_u._0_8_);
    }
    if (local_1c8.m_sock.
        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_1c8.m_sock.
                   super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        _Var6 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        _Var6 = (local_1c8.m_sock.
                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_1c8.m_sock.
         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = _Var6 + -1;
      }
      if (_Var6 == 1) {
        (*(local_1c8.m_sock.
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    aVar7.addr_.s_addr = (in4_addr_type)0;
    memset(&local_1b8,0,0x180);
    local_1b8.preferred = true;
    local_1b8.flags.m_val = 1;
    local_1b8.state = unknown;
    peVar2 = (s->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    bVar5 = (peVar2->local_endpoint).impl_.data_.base.sa_family != 2;
    if (bVar5) {
      local_1c8.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)((long)&(peVar2->local_endpoint).impl_.data_ + 8);
      local_1c8.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&(peVar2->local_endpoint).impl_.data_ + 0x10);
      local_1b8.interface_address.ipv6_address_.scope_id_ =
           (unsigned_long)(peVar2->local_endpoint).impl_.data_.v6.sin6_scope_id;
    }
    else {
      aVar7.addr_.s_addr = (in4_addr_type)(peVar2->local_endpoint).impl_.data_.v6.sin6_flowinfo;
      local_1c8.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1c8.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1b8.interface_address.ipv6_address_.scope_id_ = 0;
    }
    local_1b8.interface_address.ipv4_address_.addr_.s_addr = aVar7.addr_.s_addr;
    local_1b8.interface_address.type_ = (uint)bVar5;
    local_1b8.interface_address.ipv6_address_.addr_.__in6_u._0_8_ =
         local_1c8.m_sock.
         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1b8.interface_address.ipv6_address_.addr_.__in6_u._8_8_ =
         local_1c8.m_sock.
         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    local_1b8.netmask.type_ = (peVar2->netmask).type_;
    local_1b8.netmask.ipv4_address_.addr_.s_addr =
         (in4_addr_type)(peVar2->netmask).ipv4_address_.addr_.s_addr;
    local_1b8.netmask.ipv6_address_.addr_.__in6_u._0_8_ =
         *(undefined8 *)&(peVar2->netmask).ipv6_address_.addr_.__in6_u;
    local_1b8.netmask.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)((long)&(peVar2->netmask).ipv6_address_.addr_.__in6_u + 8);
    local_1b8.netmask.ipv6_address_.scope_id_ = (peVar2->netmask).ipv6_address_.scope_id_;
    strncpy(local_1b8.name,(peVar2->device)._M_dataplus._M_p,0x3f);
    local_1b8.name[0x3f] = '\0';
    natpmp::start((peVar2->natpmp_mapper).
                  super___shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  &local_1b8);
  }
  return;
}

Assistant:

void session_impl::start_natpmp(std::shared_ptr<aux::listen_socket_t> const& s)
	{
		// don't create mappings for local IPv6 addresses
		// they can't be reached from outside of the local network anyways
		if (is_v6(s->local_endpoint) && is_local(s->local_endpoint.address()))
			return;

		if (!s->natpmp_mapper
			&& !(s->flags & listen_socket_t::local_network)
			&& !(s->flags & listen_socket_t::proxy))
		{
			// the natpmp constructor may fail and call the callbacks
			// into the session_impl.
			s->natpmp_mapper = std::make_shared<natpmp>(m_io_context, *this, listen_socket_handle(s));
			ip_interface ip;
			ip.interface_address = s->local_endpoint.address();
			ip.netmask = s->netmask;
			std::strncpy(ip.name, s->device.c_str(), sizeof(ip.name) - 1);
			ip.name[sizeof(ip.name) - 1] = '\0';
			s->natpmp_mapper->start(ip);
		}
	}